

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

int __thiscall
draco::PointCloud::AddAttribute
          (PointCloud *this,
          unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *pa)

{
  size_type sVar1;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *in_RSI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *in_RDI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *this_00;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> local_18 [3];
  
  sVar1 = std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::size((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)(in_RDI + 2));
  this_00 = local_18;
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::unique_ptr
            (in_RDI,in_RSI);
  (**(code **)((long)&(((in_RDI->_M_t).
                        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->
                      super_GeometryAttribute).buffer_descriptor_ + 8))
            (in_RDI,sVar1 & 0xffffffff,this_00);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            (this_00);
  sVar1 = std::
          vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
          ::size((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  *)(in_RDI + 2));
  return (int)sVar1 + -1;
}

Assistant:

int PointCloud::AddAttribute(std::unique_ptr<PointAttribute> pa) {
  SetAttribute(static_cast<int>(attributes_.size()), std::move(pa));
  return static_cast<int>(attributes_.size() - 1);
}